

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O0

FieldBase * __thiscall ki::dml::Record::get_field(Record *this,string *name)

{
  bool bVar1;
  mapped_type *ppFVar2;
  string local_40 [32];
  string *local_20;
  string *name_local;
  Record *this_local;
  
  local_20 = name;
  name_local = (string *)this;
  std::__cxx11::string::string(local_40,(string *)name);
  bVar1 = has_field(this,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  if (bVar1) {
    ppFVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>_>
              ::at(&this->m_field_map,name);
    this_local = (Record *)*ppFVar2;
  }
  else {
    this_local = (Record *)0x0;
  }
  return (FieldBase *)this_local;
}

Assistant:

const FieldBase *Record::get_field(std::string name) const
	{
		if (has_field(name))
			return m_field_map.at(name);
		return nullptr;
	}